

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86::forward_inplace(BinaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int *p_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  undefined1 (*pauVar7) [16];
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM3 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  __m128 afVar24;
  binary_op_pow op;
  __m128 _b;
  binary_op_pow local_91;
  Mat *local_90;
  long local_88;
  long local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58 [2];
  float afStack_50 [2];
  float local_48 [2];
  float afStack_40 [4];
  
  p_Var1 = this->_vptr_BinaryOp_x86[-3];
  switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var1)) {
  case 0:
    iVar6 = bottom_top_blob->c;
    if (0 < (long)iVar6) {
      fVar14 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar11 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar15._0_4_ = *(float *)*pauVar7 + fVar14;
            auVar15._4_4_ = *(float *)((long)*pauVar7 + 4) + fVar14;
            auVar15._8_4_ = *(float *)((long)*pauVar7 + 8) + fVar14;
            auVar15._12_4_ = *(float *)((long)*pauVar7 + 0xc) + fVar14;
            *pauVar7 = auVar15;
            pauVar7 = pauVar7 + 1;
            iVar8 = iVar8 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar8 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar10 = 0;
          do {
            *(float *)((long)*pauVar7 + lVar10 * 4) =
                 *(float *)((long)*pauVar7 + lVar10 * 4) + fVar14;
            lVar10 = lVar10 + 1;
          } while (uVar5 - uVar9 != (int)lVar10);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar6);
    }
    break;
  case 1:
    iVar6 = bottom_top_blob->c;
    if (0 < (long)iVar6) {
      fVar14 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar11 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar18._0_4_ = *(float *)*pauVar7 - fVar14;
            auVar18._4_4_ = *(float *)((long)*pauVar7 + 4) - fVar14;
            auVar18._8_4_ = *(float *)((long)*pauVar7 + 8) - fVar14;
            auVar18._12_4_ = *(float *)((long)*pauVar7 + 0xc) - fVar14;
            *pauVar7 = auVar18;
            pauVar7 = pauVar7 + 1;
            iVar8 = iVar8 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar8 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar10 = 0;
          do {
            *(float *)((long)*pauVar7 + lVar10 * 4) =
                 *(float *)((long)*pauVar7 + lVar10 * 4) - fVar14;
            lVar10 = lVar10 + 1;
          } while (uVar5 - uVar9 != (int)lVar10);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar6);
    }
    break;
  case 2:
    iVar6 = bottom_top_blob->c;
    if (0 < (long)iVar6) {
      fVar14 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar11 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar16._0_4_ = *(float *)*pauVar7 * fVar14;
            auVar16._4_4_ = *(float *)((long)*pauVar7 + 4) * fVar14;
            auVar16._8_4_ = *(float *)((long)*pauVar7 + 8) * fVar14;
            auVar16._12_4_ = *(float *)((long)*pauVar7 + 0xc) * fVar14;
            *pauVar7 = auVar16;
            pauVar7 = pauVar7 + 1;
            iVar8 = iVar8 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar8 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar10 = 0;
          do {
            *(float *)((long)*pauVar7 + lVar10 * 4) =
                 *(float *)((long)*pauVar7 + lVar10 * 4) * fVar14;
            lVar10 = lVar10 + 1;
          } while (uVar5 - uVar9 != (int)lVar10);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar6);
    }
    break;
  case 3:
    iVar6 = bottom_top_blob->c;
    if (0 < (long)iVar6) {
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      fVar14 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var1);
      lVar11 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar17._0_4_ = *(float *)*pauVar7 * fVar14;
            auVar17._4_4_ = *(float *)((long)*pauVar7 + 4) * fVar14;
            auVar17._8_4_ = *(float *)((long)*pauVar7 + 8) * fVar14;
            auVar17._12_4_ = *(float *)((long)*pauVar7 + 0xc) * fVar14;
            *pauVar7 = auVar17;
            pauVar7 = pauVar7 + 1;
            iVar8 = iVar8 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar8 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar10 = 0;
          do {
            *(float *)((long)*pauVar7 + lVar10 * 4) =
                 *(float *)((long)*pauVar7 + lVar10 * 4) * fVar14;
            lVar10 = lVar10 + 1;
          } while (uVar5 - uVar9 != (int)lVar10);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar6);
    }
    break;
  case 4:
    iVar6 = bottom_top_blob->c;
    if (0 < (long)iVar6) {
      fVar14 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar11 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar4._4_4_ = fVar14;
            auVar4._0_4_ = fVar14;
            auVar4._8_4_ = fVar14;
            auVar4._12_4_ = fVar14;
            auVar19 = maxps(*pauVar7,auVar4);
            *pauVar7 = auVar19;
            pauVar7 = pauVar7 + 1;
            iVar8 = iVar8 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar8 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar10 = 0;
          do {
            fVar20 = *(float *)(*pauVar7 + lVar10 * 4);
            if (*(float *)(*pauVar7 + lVar10 * 4) <= fVar14) {
              fVar20 = fVar14;
            }
            *(float *)(*pauVar7 + lVar10 * 4) = fVar20;
            lVar10 = lVar10 + 1;
          } while (uVar5 - uVar9 != (int)lVar10);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar6);
    }
    break;
  case 5:
    iVar6 = bottom_top_blob->c;
    if (0 < (long)iVar6) {
      fVar14 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar11 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar3._4_4_ = fVar14;
            auVar3._0_4_ = fVar14;
            auVar3._8_4_ = fVar14;
            auVar3._12_4_ = fVar14;
            auVar19 = minps(*pauVar7,auVar3);
            *pauVar7 = auVar19;
            pauVar7 = pauVar7 + 1;
            iVar8 = iVar8 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar8 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar10 = 0;
          do {
            fVar20 = *(float *)(*pauVar7 + lVar10 * 4);
            if (fVar14 <= *(float *)(*pauVar7 + lVar10 * 4)) {
              fVar20 = fVar14;
            }
            *(float *)(*pauVar7 + lVar10 * 4) = fVar20;
            lVar10 = lVar10 + 1;
          } while (uVar5 - uVar9 != (int)lVar10);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar6);
    }
    break;
  case 6:
    local_88 = (long)bottom_top_blob->c;
    if (0 < local_88) {
      local_78 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_80 = 0;
      local_68 = ZEXT416((uint)local_78);
      local_90 = bottom_top_blob;
      fStack_74 = local_78;
      fStack_70 = local_78;
      fStack_6c = local_78;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (local_90->cstep * local_80 * local_90->elemsize + (long)local_90->data);
        local_48[1] = fStack_74;
        local_48[0] = local_78;
        afStack_40[1] = fStack_6c;
        afStack_40[0] = fStack_70;
        if (iVar6 < 4) {
          iVar8 = 0;
        }
        else {
          iVar12 = 0;
          do {
            local_58 = *(float (*) [2])*pauVar7;
            afStack_50 = *(float (*) [2])(*pauVar7 + 8);
            afVar24 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                (&local_91,(__m128 *)local_58,(__m128 *)local_48);
            auVar2._8_4_ = extraout_XMM0_Dc;
            auVar2._0_8_ = afVar24._0_8_;
            auVar2._12_4_ = extraout_XMM0_Dd;
            *pauVar7 = auVar2;
            pauVar7 = pauVar7 + 1;
            iVar8 = iVar12 + 4;
            iVar13 = iVar12 + 7;
            iVar12 = iVar8;
          } while (iVar13 < iVar6);
        }
        if (iVar6 - iVar8 != 0 && iVar8 <= iVar6) {
          lVar11 = 0;
          do {
            fVar14 = powf(*(float *)(*pauVar7 + lVar11 * 4),(float)local_68._0_4_);
            *(float *)(*pauVar7 + lVar11 * 4) = fVar14;
            lVar11 = lVar11 + 1;
          } while (iVar6 - iVar8 != (int)lVar11);
        }
        local_80 = local_80 + 1;
      } while (local_80 != local_88);
    }
    break;
  case 7:
    iVar6 = bottom_top_blob->c;
    if (0 < (long)iVar6) {
      fVar14 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar11 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar19._0_4_ = fVar14 - *(float *)*pauVar7;
            auVar19._4_4_ = fVar14 - *(float *)((long)*pauVar7 + 4);
            auVar19._8_4_ = fVar14 - *(float *)((long)*pauVar7 + 8);
            auVar19._12_4_ = fVar14 - *(float *)((long)*pauVar7 + 0xc);
            *pauVar7 = auVar19;
            pauVar7 = pauVar7 + 1;
            iVar8 = iVar8 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar8 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar10 = 0;
          do {
            *(float *)((long)*pauVar7 + lVar10 * 4) =
                 fVar14 - *(float *)((long)*pauVar7 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (uVar5 - uVar9 != (int)lVar10);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar6);
    }
    break;
  case 8:
    iVar6 = bottom_top_blob->c;
    if (0 < (long)iVar6) {
      fVar14 = *(float *)(&this->field_0xd8 + (long)p_Var1);
      uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar11 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar19 = *pauVar7;
            in_XMM3 = rcpps(in_XMM3,auVar19);
            fVar20 = fVar14 * in_XMM3._0_4_;
            fVar21 = fVar14 * in_XMM3._4_4_;
            fVar22 = fVar14 * in_XMM3._8_4_;
            fVar23 = fVar14 * in_XMM3._12_4_;
            *(float *)*pauVar7 = (fVar14 - auVar19._0_4_ * fVar20) * in_XMM3._0_4_ + fVar20;
            *(float *)(*pauVar7 + 4) = (fVar14 - auVar19._4_4_ * fVar21) * in_XMM3._4_4_ + fVar21;
            *(float *)(*pauVar7 + 8) = (fVar14 - auVar19._8_4_ * fVar22) * in_XMM3._8_4_ + fVar22;
            *(float *)(*pauVar7 + 0xc) =
                 (fVar14 - auVar19._12_4_ * fVar23) * in_XMM3._12_4_ + fVar23;
            pauVar7 = pauVar7 + 1;
            iVar8 = iVar8 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar8 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar10 = 0;
          do {
            *(float *)(*pauVar7 + lVar10 * 4) = fVar14 / *(float *)(*pauVar7 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (uVar5 - uVar9 != (int)lVar10);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar6);
    }
  }
  return 0;
}

Assistant:

int BinaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace BinaryOp_x86_functor;

    if (op_type == Operation_ADD)
        return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);

    if (op_type == Operation_SUB)
        return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);

    if (op_type == Operation_MUL)
        return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);

    if (op_type == Operation_DIV)
        return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);

    if (op_type == Operation_MAX)
        return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);

    if (op_type == Operation_MIN)
        return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);

    if (op_type == Operation_POW)
        return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);

    if (op_type == Operation_RSUB)
        return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);

    if (op_type == Operation_RDIV)
        return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);

    return 0;
}